

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip_x86.cpp
# Opt level: O3

int __thiscall ncnn::Clip_x86::forward_inplace(Clip_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  int iVar4;
  _func_int **pp_Var5;
  undefined1 auVar6 [16];
  uint uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  undefined1 (*pauVar11) [16];
  int iVar12;
  _func_int *p_Var13;
  float fVar14;
  undefined1 auVar15 [16];
  
  iVar4 = bottom_top_blob->c;
  if (0 < (long)iVar4) {
    uVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    pp_Var5 = this->_vptr_Clip_x86;
    lVar10 = 0;
    do {
      pauVar11 = (undefined1 (*) [16])
                 (bottom_top_blob->cstep * lVar10 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      if ((int)uVar7 < 4) {
        uVar8 = 0;
      }
      else {
        uVar1 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var5[-3]);
        uVar2 = *(undefined4 *)(&this->field_0xd4 + (long)pp_Var5[-3]);
        iVar12 = 3;
        do {
          auVar15._4_4_ = uVar1;
          auVar15._0_4_ = uVar1;
          auVar15._8_4_ = uVar1;
          auVar15._12_4_ = uVar1;
          auVar15 = maxps(*pauVar11,auVar15);
          auVar6._4_4_ = uVar2;
          auVar6._0_4_ = uVar2;
          auVar6._8_4_ = uVar2;
          auVar6._12_4_ = uVar2;
          auVar15 = minps(auVar15,auVar6);
          *pauVar11 = auVar15;
          pauVar11 = pauVar11 + 1;
          iVar12 = iVar12 + 4;
          uVar8 = uVar7 & 0xfffffffc;
        } while (iVar12 < (int)uVar7);
      }
      if (uVar7 - uVar8 != 0 && (int)uVar8 <= (int)uVar7) {
        lVar9 = 0;
        do {
          p_Var13 = pp_Var5[-3];
          fVar3 = *(float *)(&this->field_0xd0 + (long)p_Var13);
          fVar14 = *(float *)(*pauVar11 + lVar9 * 4);
          if (*(float *)(*pauVar11 + lVar9 * 4) < fVar3) {
            *(float *)(*pauVar11 + lVar9 * 4) = fVar3;
            p_Var13 = pp_Var5[-3];
            fVar14 = fVar3;
          }
          if (*(float *)(&this->field_0xd4 + (long)p_Var13) < fVar14) {
            *(float *)(*pauVar11 + lVar9 * 4) = *(float *)(&this->field_0xd4 + (long)p_Var13);
          }
          lVar9 = lVar9 + 1;
        } while (uVar7 - uVar8 != (int)lVar9);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != iVar4);
  }
  return 0;
}

Assistant:

int Clip_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _min_avx512 = _mm512_set1_ps(min);
        __m512 _max_avx512 = _mm512_set1_ps(max);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_max_ps(_p, _min_avx512);
            _p = _mm512_min_ps(_p, _max_avx512);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _min_avx = _mm256_set1_ps(min);
        __m256 _max_avx = _mm256_set1_ps(max);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_max_ps(_p, _min_avx);
            _p = _mm256_min_ps(_p, _max_avx);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _min = _mm_set1_ps(min);
        __m128 _max = _mm_set1_ps(max);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_max_ps(_p, _min);
            _p = _mm_min_ps(_p, _max);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < min)
                *ptr = min;
            if (*ptr > max)
                *ptr = max;
            ptr++;
        }
    }

    return 0;
}